

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitCreateYieldResult
               (RegSlot resultReg,RegSlot inputReg,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  RegSlot value;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ByteCodeWriter *this;
  
  if (resultReg == inputReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2962,"(resultReg != inputReg)","resultReg != inputReg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::Reg1(this,NewScObjectSimple,resultReg);
  uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x197,false,true);
  Js::ByteCodeWriter::PatchableProperty(this,StFld,inputReg,resultReg,uVar3,false,true);
  value = funcInfo->falseConstantRegister;
  uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x74,false,true);
  Js::ByteCodeWriter::PatchableProperty(this,StFld,value,resultReg,uVar3,false,true);
  return;
}

Assistant:

void EmitCreateYieldResult(
    Js::RegSlot resultReg,
    Js::RegSlot inputReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Assert(resultReg != inputReg);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::NewScObjectSimple, resultReg);

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::StFld,
        inputReg,
        resultReg,
        funcInfo->FindOrAddInlineCacheId(resultReg, Js::PropertyIds::value, false, true));

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::StFld,
        funcInfo->falseConstantRegister,
        resultReg,
        funcInfo->FindOrAddInlineCacheId(resultReg, Js::PropertyIds::done, false, true));
}